

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFileCreation.cpp
# Opt level: O0

uint32_t c_symlink2(LinkedObjectFile *f,vector<unsigned_char,_std::allocator<unsigned_char>_> *data,
                   uint32_t code_ptr_offset,uint32_t link_ptr_offset,SymbolLinkKind kind,char *name,
                   int seg_id)

{
  uint3 uVar1;
  int iVar2;
  byte *pbVar3;
  uint *puVar4;
  runtime_error *this;
  const_reference pvVar5;
  int in_ECX;
  string *in_RDI;
  int in_R8D;
  char *in_R9;
  bool bVar6;
  bool bVar7;
  TypeInfo *unaff_retaddr;
  Kind word_kind;
  uint32_t code_value;
  uint32_t next_reloc;
  uint32_t seek;
  uint8_t *relocPtr;
  value_type table_value;
  uint32_t initial_offset;
  size_type in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  undefined8 in_stack_ffffffffffffff18;
  LinkedObjectFile *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  LinkedObjectFile *in_stack_ffffffffffffff30;
  undefined1 local_a1 [33];
  undefined4 local_80;
  uint local_7c;
  int local_78;
  uint local_74;
  const_reference local_70;
  byte local_61;
  allocator local_49;
  string *in_stack_ffffffffffffffb8;
  TypeInfo *in_stack_ffffffffffffffc0;
  int local_18;
  
  get_type_info();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb8,in_R9,&local_49);
  TypeInfo::inform_symbol_with_no_type_info(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_18 = in_ECX;
  do {
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                        in_stack_ffffffffffffff08);
    local_61 = *pbVar3;
    local_70 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                          in_stack_ffffffffffffff08);
    local_74 = (uint)local_61;
    local_78 = local_18 + 1;
    if ((local_61 & 3) != 0) {
      local_74 = (uint)CONCAT11(local_70[1],local_61);
      local_78 = local_18 + 2;
      if ((local_61 & 2) != 0) {
        uVar1 = CONCAT12(local_70[2],CONCAT11(local_70[1],local_61));
        local_74 = (uint)uVar1;
        local_78 = local_18 + 3;
        if ((local_61 & 1) != 0) {
          local_74 = CONCAT13(local_70[3],uVar1);
          local_78 = local_18 + 4;
        }
      }
    }
    iVar2 = local_78;
    *(int *)(in_RDI + 0x14) = *(int *)(in_RDI + 0x14) + 1;
    local_18 = local_78;
    puVar4 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                                in_stack_ffffffffffffff08);
    local_7c = *puVar4;
    if (local_7c == 0xffffffff) {
      if (in_R8D == 0) {
        local_80 = 5;
      }
      else if (in_R8D == 1) {
        in_stack_ffffffffffffff20 = (LinkedObjectFile *)get_type_info();
        in_stack_ffffffffffffff30 = (LinkedObjectFile *)local_a1;
        in_stack_ffffffffffffff28 = in_R9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_a1 + 1),in_stack_ffffffffffffff28,
                   (allocator *)in_stack_ffffffffffffff30);
        TypeInfo::inform_type(unaff_retaddr,in_RDI);
        std::__cxx11::string::~string((string *)(local_a1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_a1);
        local_80 = 7;
      }
      else {
        if (in_R8D != 2) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"unhandled SymbolLinkKind");
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_80 = 4;
      }
      LinkedObjectFile::symbol_link_word
                (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                 (int)in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20,
                 (Kind)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    }
    else {
      bVar6 = (local_7c & 0xffff) == 0;
      bVar7 = (local_7c & 0xffff) == 0xffff;
      in_stack_ffffffffffffff17 = bVar6 || bVar7;
      if (!bVar6 && !bVar7) {
        __assert_fail("(code_value & 0xffff) == 0 || (code_value & 0xffff) == 0xffff",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x90,
                      "uint32_t c_symlink2(LinkedObjectFile &, const std::vector<uint8_t> &, uint32_t, uint32_t, SymbolLinkKind, const char *, int)"
                     );
      }
      if (in_R8D != 2) {
        __assert_fail("kind == SymbolLinkKind::SYMBOL",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x91,
                      "uint32_t c_symlink2(LinkedObjectFile &, const std::vector<uint8_t> &, uint32_t, uint32_t, SymbolLinkKind, const char *, int)"
                     );
      }
      LinkedObjectFile::symbol_link_offset
                (in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                 (int)in_stack_ffffffffffffff18,
                 (char *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    }
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                        in_stack_ffffffffffffff08);
    if (*pvVar5 == '\0') {
      return iVar2 + 1;
    }
  } while( true );
}

Assistant:

static uint32_t c_symlink2(LinkedObjectFile& f,
                           const std::vector<uint8_t>& data,
                           uint32_t code_ptr_offset,
                           uint32_t link_ptr_offset,
                           SymbolLinkKind kind,
                           const char* name,
                           int seg_id) {
  get_type_info().inform_symbol_with_no_type_info(name);
  auto initial_offset = code_ptr_offset;
  do {
    auto table_value = data.at(link_ptr_offset);
    const uint8_t* relocPtr = &data.at(link_ptr_offset);

    // link table has a series of variable-length-encoded integers indicating the seek amount to hit
    // each reference to the symbol.  It ends when the seek is 0, and all references to this symbol
    // have been patched.
    uint32_t seek = table_value;
    uint32_t next_reloc = link_ptr_offset + 1;

    if (seek & 3) {
      seek = (relocPtr[1] << 8) | table_value;
      next_reloc = link_ptr_offset + 2;
      if (seek & 2) {
        seek = (relocPtr[2] << 16) | seek;
        next_reloc = link_ptr_offset + 3;
        if (seek & 1) {
          seek = (relocPtr[3] << 24) | seek;
          next_reloc = link_ptr_offset + 4;
        }
      }
    }

    f.stats.total_v2_symbol_links++;
    link_ptr_offset = next_reloc;

    code_ptr_offset += (seek & 0xfffffffc);

    // the value of the code gives us more information
    uint32_t code_value = *(const uint32_t*)(&data.at(code_ptr_offset));
    if (code_value == 0xffffffff) {
      // absolute link - replace entire word with a pointer.
      LinkedWord::Kind word_kind;
      switch (kind) {
        case SymbolLinkKind::SYMBOL:
          word_kind = LinkedWord::SYM_PTR;
          break;
        case SymbolLinkKind::EMPTY_LIST:
          word_kind = LinkedWord::EMPTY_PTR;
          break;
        case SymbolLinkKind::TYPE:
          get_type_info().inform_type(name);
          word_kind = LinkedWord::TYPE_PTR;
          break;
        default:
          throw std::runtime_error("unhandled SymbolLinkKind");
      }

      f.symbol_link_word(seg_id, code_ptr_offset - initial_offset, name, word_kind);
    } else {
      // offset link - replace lower 16 bits with symbol table offset.

      assert((code_value & 0xffff) == 0 || (code_value & 0xffff) == 0xffff);
      assert(kind == SymbolLinkKind::SYMBOL);
      //      assert(false); // this case does not occur in V2/V4.  It does in V3.
      f.symbol_link_offset(seg_id, code_ptr_offset - initial_offset, name);
    }

  } while (data.at(link_ptr_offset));

  // seek past terminating 0.
  return link_ptr_offset + 1;
}